

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChBezierCurve::eval(ChVector<double> *__return_storage_ptr__,ChBezierCurve *this,double t)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong i;
  undefined1 auVar6 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar7 [64];
  undefined1 in_XMM3 [16];
  
  auVar7._8_56_ = in_register_00001208;
  auVar7._0_8_ = t;
  uVar2 = vcmpsd_avx512f(auVar7._0_16_,ZEXT816(0) << 0x40,1);
  auVar6 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar7._0_16_);
  lVar4 = ((long)(this->m_points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_points).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar5 = lVar4 - 2;
  auVar3 = vcvtusi2sd_avx512f(in_XMM3,lVar4 + -1);
  dVar1 = (double)((ulong)!(bool)((byte)uVar2 & 1) * auVar6._0_8_) * auVar3._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  auVar6 = vroundsd_avx(auVar6,auVar6,9);
  i = vcvttsd2usi_avx512f(auVar6);
  if (uVar5 < i) {
    i = uVar5;
  }
  auVar6 = vcvtusi2sd_avx512f(in_XMM3,i);
  eval(__return_storage_ptr__,this,i,dVar1 - auVar6._0_8_);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChBezierCurve::eval(double t) const {
    double par = ChClamp(t, 0.0, 1.0);
    size_t numIntervals = getNumPoints() - 1;
    double epar = par * numIntervals;
    size_t i = static_cast<size_t>(std::floor(par * numIntervals));
    ChClampValue(i, size_t(0), numIntervals - 1);

    return eval(i, epar - (double)i);
}